

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_casts.cpp
# Opt level: O3

BoundCastInfo *
duckdb::DefaultCasts::TimeCastSwitch
          (BoundCastInfo *__return_storage_ptr__,BindCastInput *input,LogicalType *source,
          LogicalType *target)

{
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> _Var1;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_20;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_18;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_10;
  
  if (target->id_ == TIME_TZ) {
    local_18._M_head_impl = (BoundCastData *)0x0;
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,
               VectorCastHelpers::TemplatedCastLoop<duckdb::dtime_t,duckdb::dtime_tz_t,duckdb::Cast>
               ,(unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                 *)&local_18,(init_cast_local_state_t)0x0);
    _Var1._M_head_impl = local_18._M_head_impl;
  }
  else if (target->id_ == VARCHAR) {
    local_10._M_head_impl = (BoundCastData *)0x0;
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,
               VectorCastHelpers::StringCast<duckdb::dtime_t,duckdb::StringCast>,
               (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                *)&local_10,(init_cast_local_state_t)0x0);
    _Var1._M_head_impl = local_10._M_head_impl;
  }
  else {
    local_20._M_head_impl = (BoundCastData *)0x0;
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,TryVectorNullCast,
               (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                *)&local_20,(init_cast_local_state_t)0x0);
    _Var1._M_head_impl = local_20._M_head_impl;
  }
  if (_Var1._M_head_impl != (BoundCastData *)0x0) {
    (*(_Var1._M_head_impl)->_vptr_BoundCastData[1])();
  }
  return __return_storage_ptr__;
}

Assistant:

BoundCastInfo DefaultCasts::TimeCastSwitch(BindCastInput &input, const LogicalType &source, const LogicalType &target) {
	// now switch on the result type
	switch (target.id()) {
	case LogicalTypeId::VARCHAR:
		// time to varchar
		return BoundCastInfo(&VectorCastHelpers::StringCast<dtime_t, duckdb::StringCast>);
	case LogicalTypeId::TIME_TZ:
		// time to time with time zone
		return BoundCastInfo(&VectorCastHelpers::TemplatedCastLoop<dtime_t, dtime_tz_t, duckdb::Cast>);
	default:
		return TryVectorNullCast;
	}
}